

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

int ctemplate_htmlparser::jsparser_buffer_absolute_pos(jsparser_ctx *js,int pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = -1;
  if (-0x12 < pos) {
    iVar1 = js->buffer_end;
    iVar4 = iVar1 - js->buffer_start;
    iVar3 = (iVar1 + 0x12) - js->buffer_start;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    if (-iVar3 <= pos) {
      iVar1 = (iVar1 + pos) % 0x12;
      iVar2 = iVar1 + 0x12;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

static inline int jsparser_buffer_absolute_pos(jsparser_ctx *js, int pos)
{
  int absolute_pos;
  int buffer_len;
  assert(pos < 0);

  if(pos <= -JSPARSER_RING_BUFFER_SIZE) {
    return -1;
  }

  buffer_len = js->buffer_end - js->buffer_start;
  if (buffer_len < 0) {
    buffer_len += JSPARSER_RING_BUFFER_SIZE;
  }

  if (pos < -buffer_len) {
    return -1;
  }

  absolute_pos = (pos + js->buffer_end) % JSPARSER_RING_BUFFER_SIZE;
  if (absolute_pos < 0) {
    absolute_pos += JSPARSER_RING_BUFFER_SIZE;
  }

  return absolute_pos;
}